

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

void EvpathRSTimestepArrived
               (CP_Services Svcs,DP_RS_Stream RS_Stream_v,size_t Timestep,
               SstPreloadModeType PreloadMode)

{
  (*Svcs->verbose)(*(void **)((long)RS_Stream_v + 8),4,
                   "EVPATH registering reader arrival of TS %ld metadata, preload mode %d\n",
                   Timestep,(ulong)PreloadMode);
  if (*(SstPreloadModeType *)((long)RS_Stream_v + 0x70) != PreloadMode) {
    *(size_t *)((long)RS_Stream_v + 0x78) = Timestep;
    *(SstPreloadModeType *)((long)RS_Stream_v + 0x70) = PreloadMode;
  }
  return;
}

Assistant:

static void EvpathRSTimestepArrived(CP_Services Svcs, DP_RS_Stream RS_Stream_v, size_t Timestep,
                                    SstPreloadModeType PreloadMode)
{
    Evpath_RS_Stream RS_Stream = (Evpath_RS_Stream)RS_Stream_v;
    Svcs->verbose(RS_Stream->CP_Stream, DPPerRankVerbose,
                  "EVPATH registering reader arrival of TS %ld metadata, preload mode "
                  "%d\n",
                  Timestep, PreloadMode);
    if (PreloadMode != RS_Stream->CurPreloadMode)
    {
        RS_Stream->PreloadActiveTimestep = Timestep;
        RS_Stream->CurPreloadMode = PreloadMode;
    }
}